

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O2

bool __thiscall
Minisat::OnlineProofChecker::addClause<Minisat::Clause>
          (OnlineProofChecker *this,Clause *clause,Lit *remLit,bool checkOnly)

{
  vec<Minisat::Lit> *this_00;
  bool bVar1;
  int i;
  ulong uVar2;
  Lit local_34;
  
  if ((this->tmpLits).data != (Lit *)0x0) {
    (this->tmpLits).sz = 0;
  }
  this_00 = &this->tmpLits;
  if (remLit->x != -2) {
    vec<Minisat::Lit>::push(this_00,remLit);
  }
  for (uVar2 = 0; uVar2 < (ulong)clause->header >> 0x22; uVar2 = uVar2 + 1) {
    if (*(int *)(&clause[1].header.field_0x0 + uVar2 * 4) != remLit->x) {
      vec<Minisat::Lit>::push(this_00,&local_34);
    }
  }
  bVar1 = addClause(this,this_00,checkOnly);
  return bVar1;
}

Assistant:

inline bool OnlineProofChecker::addClause(const T &clause, const Lit &remLit, bool checkOnly)
{
    // create a clause where remLit is the first literal
    tmpLits.clear();
    if (remLit != lit_Undef) {
        tmpLits.push(remLit);
    }
    for (int i = 0; i < clause.size(); ++i) {
        if (clause[i] != remLit) {
            tmpLits.push(clause[i]);
        }
    }
    // add this clause in the usual way
    return addClause(tmpLits, checkOnly);
}